

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

Const * kratos::Const::constant(string *value,uint32_t width)

{
  element_type *peVar1;
  undefined1 local_28 [8];
  shared_ptr<kratos::StringConst> p;
  uint32_t width_local;
  string *value_local;
  
  p.super___shared_ptr<kratos::StringConst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       width;
  std::make_shared<kratos::StringConst,std::__cxx11::string,unsigned_int&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28,
             (uint *)value);
  std::
  unordered_set<std::shared_ptr<kratos::Const>,std::hash<std::shared_ptr<kratos::Const>>,std::equal_to<std::shared_ptr<kratos::Const>>,std::allocator<std::shared_ptr<kratos::Const>>>
  ::emplace<std::shared_ptr<kratos::StringConst>&>
            ((unordered_set<std::shared_ptr<kratos::Const>,std::hash<std::shared_ptr<kratos::Const>>,std::equal_to<std::shared_ptr<kratos::Const>>,std::allocator<std::shared_ptr<kratos::Const>>>
              *)consts_,(shared_ptr<kratos::StringConst> *)local_28);
  peVar1 = std::__shared_ptr_access<kratos::StringConst,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<kratos::StringConst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_28);
  std::shared_ptr<kratos::StringConst>::~shared_ptr((shared_ptr<kratos::StringConst> *)local_28);
  return &peVar1->super_Const;
}

Assistant:

Const &Const::constant(std::string value, uint32_t width) {
    auto p = std::make_shared<StringConst>(std::move(value), width);
    consts_.emplace(p);
    return *p;
}